

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

void __thiscall SQCompiler::MoveIfCurrentTargetIsLocal(SQCompiler *this)

{
  SQFuncState *this_00;
  bool bVar1;
  SQUnsignedInteger stkpos;
  SQInteger arg1;
  SQInteger arg0;
  
  stkpos = SQFuncState::TopTarget(this->_fs);
  bVar1 = SQFuncState::IsLocal(this->_fs,stkpos);
  if (bVar1) {
    arg1 = SQFuncState::PopTarget(this->_fs);
    this_00 = this->_fs;
    arg0 = SQFuncState::PushTarget(this_00,-1);
    SQFuncState::AddInstruction(this_00,_OP_MOVE,arg0,arg1,0,0);
    return;
  }
  return;
}

Assistant:

void MoveIfCurrentTargetIsLocal() {
        SQInteger trg = _fs->TopTarget();
        if(_fs->IsLocal(trg)) {
            trg = _fs->PopTarget(); //pops the target and moves it
            _fs->AddInstruction(_OP_MOVE, _fs->PushTarget(), trg);
        }
    }